

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

void ParseFunctionDef(FScanner *sc,PClassActor *cls,FName *funcname,TArray<PType_*,_PType_*> *rets,
                     DWORD funcflags)

{
  int iVar1;
  DWORD DVar2;
  bool bVar3;
  AFuncDesc *pAVar4;
  PFunction *this;
  PPrototype *proto;
  PSymbol *pPVar5;
  PColor **ppPVar6;
  PClass *restrict;
  FxExpression *pFVar7;
  undefined4 uVar8;
  PType *type;
  undefined1 local_90 [20];
  DWORD local_7c;
  TArray<unsigned_int,_unsigned_int> argflags;
  TArray<PType_*,_PType_*> args;
  FName local_34;
  
  local_90._8_8_ = cls;
  if (cls == (PClassActor *)0x0) {
    __assert_fail("cls != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                  ,0x1c5,
                  "void ParseFunctionDef(FScanner &, PClassActor *, FName, TArray<PType *> &, DWORD)"
                 );
  }
  args.Array = (PType **)0x0;
  args.Most = 0;
  args.Count = 0;
  argflags.Array = (uint *)0x0;
  argflags.Most = 0;
  argflags.Count = 0;
  pAVar4 = FindFunction(FName::NameData.NameArray[funcname->Index].Text);
  if (pAVar4 == (AFuncDesc *)0x0) {
    FScanner::ScriptMessage
              (sc,"The function \'%s\' has not been exported from the executable.",
               FName::NameData.NameArray[funcname->Index].Text);
    FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
  }
  FScanner::MustGetToken(sc,0x28);
  SetImplicitArgs(&args,&argflags,(PClassActor *)local_90._8_8_,funcflags);
  bVar3 = FScanner::CheckToken(sc,0x29);
  local_7c = funcflags;
  if (!bVar3) {
    while (sc->TokenType != 0x29) {
      type = (PType *)0x0;
      do {
        do {
          bVar3 = FScanner::CheckToken(sc,0x168);
        } while (bVar3);
        bVar3 = FScanner::CheckToken(sc,0x153);
      } while (bVar3);
      FScanner::MustGetAnyToken(sc);
      iVar1 = sc->TokenType;
      switch(iVar1) {
      case 0x132:
        ppPVar6 = (PColor **)&TypeBool;
        break;
      case 0x133:
        ppPVar6 = (PColor **)&TypeFloat64;
        break;
      case 0x134:
      case 0x135:
      case 0x136:
      case 0x137:
      case 0x138:
      case 0x139:
      case 0x13b:
      case 0x13c:
      case 0x13d:
      case 0x13e:
      case 0x13f:
      case 0x141:
      case 0x142:
switchD_005db78d_caseD_134:
        FScanner::TokenName((FScanner *)local_90,iVar1,sc->String);
        FScanner::ScriptMessage
                  (sc,"Unknown variable type %s",CONCAT44(local_90._4_4_,local_90._0_4_));
        FString::~FString((FString *)local_90);
        type = (PType *)TypeSInt32;
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        goto LAB_005db880;
      case 0x13a:
        ppPVar6 = (PColor **)&TypeSInt32;
        break;
      case 0x140:
        FScanner::MustGetToken(sc,0x3c);
        FScanner::MustGetToken(sc,0x101);
        restrict = PClass::FindClass(sc->String);
        if (restrict == (PClass *)0x0) {
          FScanner::ScriptMessage(sc,"Unknown class type %s",sc->String);
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        }
        else {
          type = (PType *)NewClassPointer(restrict);
        }
        FScanner::MustGetToken(sc,0x3e);
        goto LAB_005db880;
      case 0x143:
        ppPVar6 = (PColor **)&TypeName;
        break;
      case 0x144:
        ppPVar6 = (PColor **)&TypeString;
        break;
      case 0x145:
        ppPVar6 = (PColor **)&TypeSound;
        break;
      case 0x146:
        ppPVar6 = (PColor **)&TypeState;
        break;
      case 0x147:
        ppPVar6 = &TypeColor;
        break;
      default:
        if (iVar1 != 0x10a) goto switchD_005db78d_caseD_134;
        type = (PType *)0x0;
        FScanner::MustGetToken(sc,0x29);
        FScanner::UnGet(sc);
        goto LAB_005db880;
      }
      type = (PType *)*ppPVar6;
LAB_005db880:
      bVar3 = FScanner::CheckToken(sc,0x2c);
      if ((bVar3) || (bVar3 = FScanner::CheckToken(sc,0x29), bVar3)) {
        FScanner::UnGet(sc);
      }
      else {
        FScanner::MustGetToken(sc,0x101);
      }
      bVar3 = FScanner::CheckToken(sc,0x3d);
      uVar8 = 0;
      if (bVar3) {
        pFVar7 = ParseParameter(sc,(PClassActor *)local_90._8_8_,type,true);
        uVar8 = 1;
        if (pFVar7 != (FxExpression *)0x0) {
          (*pFVar7->_vptr_FxExpression[1])(pFVar7);
        }
      }
      TArray<PType_*,_PType_*>::Push(&args,&type);
      local_90._0_4_ = uVar8;
      TArray<unsigned_int,_unsigned_int>::Push(&argflags,(uint *)local_90);
      FScanner::MustGetAnyToken(sc);
      iVar1 = sc->TokenType;
      if ((iVar1 != 0x29) && (iVar1 != 0x2c)) {
        FScanner::TokenName((FScanner *)local_90,iVar1,sc->String);
        FScanner::ScriptError
                  (sc,"Expected \',\' or \')\' but got %s instead",
                   CONCAT44(local_90._4_4_,local_90._0_4_));
        FString::~FString((FString *)local_90);
      }
    }
  }
  FScanner::MustGetToken(sc,0x3b);
  DVar2 = local_7c;
  if (pAVar4 != (AFuncDesc *)0x0) {
    this = (PFunction *)DObject::operator_new(0x40);
    local_34 = (FName)funcname->Index;
    PFunction::PFunction(this,&local_34);
    proto = NewPrototype(rets,&args);
    PFunction::AddVariant(this,proto,&argflags,&(*pAVar4->VMPointer)->super_VMFunction);
    this->Flags = DVar2;
    pPVar5 = PSymbolTable::AddSymbol
                       (&(((PClass *)local_90._8_8_)->super_PStruct).super_PNamedType.
                         super_PCompoundType.super_PType.Symbols,(PSymbol *)this);
    if (pPVar5 == (PSymbol *)0x0) {
      (*(this->super_PSymbol).super_DObject._vptr_DObject[2])(this);
      FScanner::ScriptMessage
                (sc,"\'%s\' is already defined in class \'%s\'.",
                 FName::NameData.NameArray[funcname->Index].Text,
                 FName::NameData.NameArray
                 [(((PClass *)local_90._8_8_)->super_PStruct).super_PNamedType.TypeName.Index].Text)
      ;
      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
    }
  }
  TArray<unsigned_int,_unsigned_int>::~TArray(&argflags);
  TArray<PType_*,_PType_*>::~TArray(&args);
  return;
}

Assistant:

void ParseFunctionDef(FScanner &sc, PClassActor *cls, FName funcname,
	TArray<PType *> &rets, DWORD funcflags)
{
	assert(cls != NULL);

	const AFuncDesc *afd;
	TArray<PType *> args;
	TArray<DWORD> argflags;

	afd = FindFunction(funcname);
	if (afd == NULL)
	{
		sc.ScriptMessage ("The function '%s' has not been exported from the executable.", funcname.GetChars());
		FScriptPosition::ErrorCounter++;
	}
	sc.MustGetToken('(');

	SetImplicitArgs(&args, &argflags, cls, funcflags);
	ParseArgListDef(sc, cls, args, argflags);

	if (afd != NULL)
	{
		PFunction *sym = new PFunction(funcname);
		sym->AddVariant(NewPrototype(rets, args), argflags, *(afd->VMPointer));
		sym->Flags = funcflags;
		if (cls->Symbols.AddSymbol(sym) == NULL)
		{
			delete sym;
			sc.ScriptMessage ("'%s' is already defined in class '%s'.",
				funcname.GetChars(), cls->TypeName.GetChars());
			FScriptPosition::ErrorCounter++;
		}
	}
}